

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableEndRow(ImGuiTable *table)

{
  ImVec4 *pIVar1;
  ImVec2 IVar2;
  char cVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *pIVar5;
  ImGuiTableColumn *pIVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ulong uVar32;
  ImVec2 IVar33;
  ImVec2 IVar34;
  ImGuiContext *pIVar35;
  int iVar36;
  ImS8 *pIVar37;
  long lVar38;
  int iVar39;
  ImGuiTableCellData *pIVar40;
  long lVar41;
  int iVar42;
  ImGuiTableCellData *pIVar43;
  int iVar44;
  ImU32 col;
  ImU32 col_00;
  uint uVar45;
  uint uVar46;
  float fVar47;
  long lVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar61;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  long lVar60;
  float fVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar68;
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar85;
  undefined1 auVar83 [16];
  int iVar86;
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  int iVar100;
  int iVar104;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  ImVec2 local_88;
  ImVec2 local_80;
  ImU32 local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined1 local_68 [16];
  ImVec2 local_50;
  undefined1 local_48 [16];
  long lVar66;
  
  pIVar35 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  if (table->CurrentColumn != -1) {
    TableEndCell(table);
  }
  if (pIVar35->LogEnabled == true) {
    LogRenderedText((ImVec2 *)0x0,"|",(char *)0x0);
  }
  fVar62 = table->RowPosY2;
  auVar49 = ZEXT416((uint)fVar62);
  (pIVar4->DC).CursorPos.y = fVar62;
  fVar47 = table->RowPosY1;
  local_68 = ZEXT416((uint)fVar47);
  iVar36 = table->CurrentRow;
  if (iVar36 == 0) {
    table->LastFirstRowHeight = fVar62 - fVar47;
  }
  iVar39 = iVar36 + 1;
  iVar42 = (int)table->FreezeRowsCount;
  iVar44 = (int)table->FreezeRowsRequest;
  if (((table->InnerClipRect).Min.y <= fVar62) && (fVar47 <= (table->InnerClipRect).Max.y)) {
    col_00 = table->RowBgColor[0];
    local_74 = iVar44;
    local_48 = auVar49;
    if ((col_00 == 0x1000000) && (col_00 = 0, (table->Flags & 0x40) != 0)) {
      col_00 = GetColorU32((table->RowBgColorCounter & 1U) + 0x2d,1.0);
      iVar36 = table->CurrentRow;
    }
    col = table->RowBgColor[1];
    local_78 = 0;
    if (col == 0x1000000) {
      col = 0;
    }
    if (((0 < iVar36) || (table->InnerWindow == table->OuterWindow)) &&
       (local_78 = 0, (table->Flags & 0x80) != 0)) {
      local_78 = table->RowBgColor[(ulong)((table->field_0x92 & 1) == 0) + 2];
    }
    cVar3 = table->RowCellDataCurrent;
    local_70 = iVar42;
    local_6c = iVar39;
    if ((-1 < cVar3 || iVar39 == iVar42) || (local_78 != 0 || (col != 0 || col_00 != 0))) {
      if ((table->Flags & 0x100000) == 0) {
        fVar62 = (table->Bg0ClipRectForDrawCmd).Min.y;
        fVar47 = (table->Bg0ClipRectForDrawCmd).Max.x;
        fVar68 = (table->Bg0ClipRectForDrawCmd).Max.y;
        pIVar5 = pIVar4->DrawList;
        (pIVar5->_CmdHeader).ClipRect.x = (table->Bg0ClipRectForDrawCmd).Min.x;
        (pIVar5->_CmdHeader).ClipRect.y = fVar62;
        (pIVar5->_CmdHeader).ClipRect.z = fVar47;
        (pIVar5->_CmdHeader).ClipRect.w = fVar68;
      }
      ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar4->DrawList,0);
    }
    if (col != 0 || col_00 != 0) {
      IVar2 = (table->BgClipRect).Min;
      fVar62 = (table->WorkRect).Min.x;
      fVar47 = IVar2.x;
      fVar68 = IVar2.y;
      uVar45 = -(uint)(fVar47 <= fVar62);
      uVar46 = -(uint)(fVar68 <= (float)local_68._0_4_);
      local_88.y = (float)(~uVar46 & (uint)fVar68 | local_68._0_4_ & uVar46);
      local_88.x = (float)(~uVar45 & (uint)fVar47 | (uint)fVar62 & uVar45);
      auVar50._8_8_ = 0;
      auVar50._0_4_ = (table->BgClipRect).Max.x;
      auVar50._4_4_ = (table->BgClipRect).Max.y;
      auVar49._4_4_ = local_48._0_4_;
      auVar49._0_4_ = (table->WorkRect).Max.x;
      auVar49._8_4_ = 0;
      auVar49._12_4_ = local_48._4_4_;
      auVar49 = minps(auVar49,auVar50);
      local_80 = auVar49._0_8_;
      if ((col_00 != 0) && (local_88.y < auVar49._4_4_)) {
        ImDrawList::AddRectFilled(pIVar4->DrawList,&local_88,&local_80,col_00,0.0,0xf);
      }
      if ((col != 0) && (local_88.y < local_80.y)) {
        ImDrawList::AddRectFilled(pIVar4->DrawList,&local_88,&local_80,col,0.0,0xf);
      }
    }
    if ((-1 < cVar3) && (-1 < (long)table->RowCellDataCurrent)) {
      pIVar40 = (table->RowCellData).Data;
      pIVar43 = pIVar40 + table->RowCellDataCurrent;
      do {
        cVar3 = pIVar40->Column;
        pIVar6 = (table->Columns).Data;
        fVar62 = pIVar6[cVar3].MinX;
        if (pIVar6[cVar3].PrevEnabledColumn == -1) {
          fVar62 = fVar62 - table->CellSpacingX1;
        }
        fVar47 = pIVar6[cVar3].MaxX;
        if (pIVar6[cVar3].NextEnabledColumn == -1) {
          fVar47 = fVar47 + table->CellSpacingX2;
        }
        IVar2 = (table->BgClipRect).Min;
        auVar87._4_4_ = table->RowPosY2;
        auVar87._0_4_ = fVar47;
        auVar87._8_8_ = 0;
        fVar47 = IVar2.x;
        fVar68 = IVar2.y;
        uVar45 = -(uint)(fVar47 <= fVar62);
        uVar46 = -(uint)(fVar68 <= table->RowPosY1);
        uVar32 = CONCAT44(~uVar46 & (uint)fVar68,~uVar45 & (uint)fVar47) |
                 CONCAT44((uint)table->RowPosY1 & uVar46,(uint)fVar62 & uVar45);
        auVar64._8_8_ = 0;
        auVar64._0_4_ = (table->BgClipRect).Max.x;
        auVar64._4_4_ = (table->BgClipRect).Max.y;
        auVar49 = minps(auVar87,auVar64);
        fVar62 = pIVar6[cVar3].ClipRect.Min.x;
        fVar47 = (float)uVar32;
        uVar45 = -(uint)(fVar62 <= fVar47);
        local_88.y = (float)(uVar32 >> 0x20);
        local_88.x = (float)(~uVar45 & (uint)fVar62 | (uint)fVar47 & uVar45);
        auVar83 = auVar49;
        if (pIVar6[cVar3].MaxX <= auVar49._0_4_) {
          auVar83._4_12_ = auVar49._4_12_;
          auVar83._0_4_ = pIVar6[cVar3].MaxX;
        }
        local_80.y = auVar49._4_4_;
        local_80.x = auVar83._0_4_;
        ImDrawList::AddRectFilled(pIVar4->DrawList,&local_88,&local_80,pIVar40->BgColor,0.0,0xf);
        pIVar40 = pIVar40 + 1;
      } while (pIVar40 <= pIVar43);
    }
    if (((local_78 != 0) && ((table->BgClipRect).Min.y <= (float)local_68._0_4_)) &&
       ((float)local_68._0_4_ < (table->BgClipRect).Max.y)) {
      local_88.y = (float)local_68._0_4_;
      local_88.x = table->BorderX1;
      local_50.x = table->BorderX2;
      local_50.y = (float)local_68._0_4_;
      ImDrawList::AddLine(pIVar4->DrawList,&local_88,&local_50,local_78,1.0);
    }
    iVar39 = local_6c;
    iVar42 = local_70;
    iVar44 = local_74;
    if (((local_6c == local_70) && ((table->BgClipRect).Min.y <= (float)local_48._0_4_)) &&
       ((float)local_48._0_4_ < (table->BgClipRect).Max.y)) {
      local_88.y = (float)local_48._0_4_;
      local_88.x = table->BorderX1;
      local_50.x = table->BorderX2;
      local_50.y = (float)local_48._0_4_;
      ImDrawList::AddLine(pIVar4->DrawList,&local_88,&local_50,table->BorderColorStrong,1.0);
    }
  }
  auVar49 = _DAT_00165e40;
  if (iVar39 == iVar44) {
    iVar36 = table->ColumnsCount;
    if (0 < (long)iVar36) {
      lVar38 = (long)table->FreezeColumnsCount;
      lVar41 = (long)iVar36 + -1;
      local_68._8_4_ = (int)lVar41;
      local_68._0_8_ = lVar41;
      local_68._12_4_ = (int)((ulong)lVar41 >> 0x20);
      pIVar37 = &((table->Columns).Data)->NavLayerCurrent;
      lVar41 = 0xf;
      auVar50 = local_68;
      auVar65 = _DAT_0016f640;
      auVar67 = _DAT_0016f650;
      auVar69 = _DAT_0016f660;
      auVar70 = _DAT_0016f670;
      auVar71 = _DAT_0016f680;
      auVar72 = _DAT_0016f690;
      auVar73 = _DAT_00165e20;
      auVar74 = _DAT_00165e30;
      do {
        auVar83 = local_68 ^ auVar49;
        auVar87 = auVar74 ^ auVar49;
        iVar44 = auVar83._0_4_;
        iVar100 = -(uint)(iVar44 < auVar87._0_4_);
        iVar61 = auVar83._4_4_;
        auVar89._4_4_ = -(uint)(iVar61 < auVar87._4_4_);
        iVar85 = auVar83._8_4_;
        iVar104 = -(uint)(iVar85 < auVar87._8_4_);
        iVar86 = auVar83._12_4_;
        auVar89._12_4_ = -(uint)(iVar86 < auVar87._12_4_);
        auVar17._4_4_ = iVar100;
        auVar17._0_4_ = iVar100;
        auVar17._8_4_ = iVar104;
        auVar17._12_4_ = iVar104;
        auVar50 = pshuflw(auVar50,auVar17,0xe8);
        auVar88._4_4_ = -(uint)(auVar87._4_4_ == iVar61);
        auVar88._12_4_ = -(uint)(auVar87._12_4_ == iVar86);
        auVar88._0_4_ = auVar88._4_4_;
        auVar88._8_4_ = auVar88._12_4_;
        auVar87 = pshuflw(in_XMM11,auVar88,0xe8);
        auVar89._0_4_ = auVar89._4_4_;
        auVar89._8_4_ = auVar89._12_4_;
        auVar83 = pshuflw(auVar50,auVar89,0xe8);
        auVar51._8_4_ = 0xffffffff;
        auVar51._0_8_ = 0xffffffffffffffff;
        auVar51._12_4_ = 0xffffffff;
        auVar51 = (auVar83 | auVar87 & auVar50) ^ auVar51;
        auVar50 = packssdw(auVar51,auVar51);
        if ((auVar50 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *pIVar37 = lVar41 + -0xf < lVar38;
        }
        auVar18._4_4_ = iVar100;
        auVar18._0_4_ = iVar100;
        auVar18._8_4_ = iVar104;
        auVar18._12_4_ = iVar104;
        auVar89 = auVar88 & auVar18 | auVar89;
        auVar50 = packssdw(auVar89,auVar89);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 ^ auVar7,auVar50 ^ auVar7);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._0_4_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0x68) = lVar41 + -0xe < lVar38;
        }
        auVar50 = auVar73 ^ auVar49;
        auVar75._0_4_ = -(uint)(iVar44 < auVar50._0_4_);
        auVar75._4_4_ = -(uint)(iVar61 < auVar50._4_4_);
        auVar75._8_4_ = -(uint)(iVar85 < auVar50._8_4_);
        auVar75._12_4_ = -(uint)(iVar86 < auVar50._12_4_);
        auVar90._4_4_ = auVar75._0_4_;
        auVar90._0_4_ = auVar75._0_4_;
        auVar90._8_4_ = auVar75._8_4_;
        auVar90._12_4_ = auVar75._8_4_;
        iVar100 = -(uint)(auVar50._4_4_ == iVar61);
        iVar104 = -(uint)(auVar50._12_4_ == iVar86);
        auVar19._4_4_ = iVar100;
        auVar19._0_4_ = iVar100;
        auVar19._8_4_ = iVar104;
        auVar19._12_4_ = iVar104;
        auVar101._4_4_ = auVar75._4_4_;
        auVar101._0_4_ = auVar75._4_4_;
        auVar101._8_4_ = auVar75._12_4_;
        auVar101._12_4_ = auVar75._12_4_;
        auVar50 = auVar19 & auVar90 | auVar101;
        auVar50 = packssdw(auVar50,auVar50);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 ^ auVar8,auVar50 ^ auVar8);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._0_4_ >> 0x10 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0xd0) = lVar41 + -0xd < lVar38;
        }
        auVar50 = pshufhw(auVar50,auVar90,0x84);
        auVar20._4_4_ = iVar100;
        auVar20._0_4_ = iVar100;
        auVar20._8_4_ = iVar104;
        auVar20._12_4_ = iVar104;
        auVar87 = pshufhw(auVar75,auVar20,0x84);
        auVar83 = pshufhw(auVar50,auVar101,0x84);
        auVar52._8_4_ = 0xffffffff;
        auVar52._0_8_ = 0xffffffffffffffff;
        auVar52._12_4_ = 0xffffffff;
        auVar52 = (auVar83 | auVar87 & auVar50) ^ auVar52;
        auVar50 = packssdw(auVar52,auVar52);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._0_4_ >> 0x18 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0x138) = lVar41 + -0xc < lVar38;
        }
        auVar50 = auVar72 ^ auVar49;
        auVar76._0_4_ = -(uint)(iVar44 < auVar50._0_4_);
        auVar76._4_4_ = -(uint)(iVar61 < auVar50._4_4_);
        auVar76._8_4_ = -(uint)(iVar85 < auVar50._8_4_);
        auVar76._12_4_ = -(uint)(iVar86 < auVar50._12_4_);
        auVar21._4_4_ = auVar76._0_4_;
        auVar21._0_4_ = auVar76._0_4_;
        auVar21._8_4_ = auVar76._8_4_;
        auVar21._12_4_ = auVar76._8_4_;
        auVar87 = pshuflw(auVar101,auVar21,0xe8);
        auVar53._0_4_ = -(uint)(auVar50._0_4_ == iVar44);
        auVar53._4_4_ = -(uint)(auVar50._4_4_ == iVar61);
        auVar53._8_4_ = -(uint)(auVar50._8_4_ == iVar85);
        auVar53._12_4_ = -(uint)(auVar50._12_4_ == iVar86);
        auVar91._4_4_ = auVar53._4_4_;
        auVar91._0_4_ = auVar53._4_4_;
        auVar91._8_4_ = auVar53._12_4_;
        auVar91._12_4_ = auVar53._12_4_;
        auVar50 = pshuflw(auVar53,auVar91,0xe8);
        auVar92._4_4_ = auVar76._4_4_;
        auVar92._0_4_ = auVar76._4_4_;
        auVar92._8_4_ = auVar76._12_4_;
        auVar92._12_4_ = auVar76._12_4_;
        auVar83 = pshuflw(auVar76,auVar92,0xe8);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 & auVar87,(auVar83 | auVar50 & auVar87) ^ auVar9);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar37 + 0x1a0) = lVar41 + -0xb < lVar38;
        }
        auVar22._4_4_ = auVar76._0_4_;
        auVar22._0_4_ = auVar76._0_4_;
        auVar22._8_4_ = auVar76._8_4_;
        auVar22._12_4_ = auVar76._8_4_;
        auVar92 = auVar91 & auVar22 | auVar92;
        auVar83 = packssdw(auVar92,auVar92);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50,auVar83 ^ auVar10);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._4_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0x208) = lVar41 + -10 < lVar38;
        }
        auVar50 = auVar71 ^ auVar49;
        auVar77._0_4_ = -(uint)(iVar44 < auVar50._0_4_);
        auVar77._4_4_ = -(uint)(iVar61 < auVar50._4_4_);
        auVar77._8_4_ = -(uint)(iVar85 < auVar50._8_4_);
        auVar77._12_4_ = -(uint)(iVar86 < auVar50._12_4_);
        auVar93._4_4_ = auVar77._0_4_;
        auVar93._0_4_ = auVar77._0_4_;
        auVar93._8_4_ = auVar77._8_4_;
        auVar93._12_4_ = auVar77._8_4_;
        iVar100 = -(uint)(auVar50._4_4_ == iVar61);
        iVar104 = -(uint)(auVar50._12_4_ == iVar86);
        auVar23._4_4_ = iVar100;
        auVar23._0_4_ = iVar100;
        auVar23._8_4_ = iVar104;
        auVar23._12_4_ = iVar104;
        auVar102._4_4_ = auVar77._4_4_;
        auVar102._0_4_ = auVar77._4_4_;
        auVar102._8_4_ = auVar77._12_4_;
        auVar102._12_4_ = auVar77._12_4_;
        auVar50 = auVar23 & auVar93 | auVar102;
        auVar50 = packssdw(auVar50,auVar50);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 ^ auVar11,auVar50 ^ auVar11);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar37 + 0x270) = lVar41 + -9 < lVar38;
        }
        auVar50 = pshufhw(auVar50,auVar93,0x84);
        auVar24._4_4_ = iVar100;
        auVar24._0_4_ = iVar100;
        auVar24._8_4_ = iVar104;
        auVar24._12_4_ = iVar104;
        auVar87 = pshufhw(auVar77,auVar24,0x84);
        auVar83 = pshufhw(auVar50,auVar102,0x84);
        auVar54._8_4_ = 0xffffffff;
        auVar54._0_8_ = 0xffffffffffffffff;
        auVar54._12_4_ = 0xffffffff;
        auVar54 = (auVar83 | auVar87 & auVar50) ^ auVar54;
        auVar50 = packssdw(auVar54,auVar54);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._6_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0x2d8) = lVar41 + -8 < lVar38;
        }
        auVar50 = auVar70 ^ auVar49;
        auVar78._0_4_ = -(uint)(iVar44 < auVar50._0_4_);
        auVar78._4_4_ = -(uint)(iVar61 < auVar50._4_4_);
        auVar78._8_4_ = -(uint)(iVar85 < auVar50._8_4_);
        auVar78._12_4_ = -(uint)(iVar86 < auVar50._12_4_);
        auVar25._4_4_ = auVar78._0_4_;
        auVar25._0_4_ = auVar78._0_4_;
        auVar25._8_4_ = auVar78._8_4_;
        auVar25._12_4_ = auVar78._8_4_;
        auVar87 = pshuflw(auVar102,auVar25,0xe8);
        auVar55._0_4_ = -(uint)(auVar50._0_4_ == iVar44);
        auVar55._4_4_ = -(uint)(auVar50._4_4_ == iVar61);
        auVar55._8_4_ = -(uint)(auVar50._8_4_ == iVar85);
        auVar55._12_4_ = -(uint)(auVar50._12_4_ == iVar86);
        auVar94._4_4_ = auVar55._4_4_;
        auVar94._0_4_ = auVar55._4_4_;
        auVar94._8_4_ = auVar55._12_4_;
        auVar94._12_4_ = auVar55._12_4_;
        auVar50 = pshuflw(auVar55,auVar94,0xe8);
        auVar95._4_4_ = auVar78._4_4_;
        auVar95._0_4_ = auVar78._4_4_;
        auVar95._8_4_ = auVar78._12_4_;
        auVar95._12_4_ = auVar78._12_4_;
        auVar83 = pshuflw(auVar78,auVar95,0xe8);
        auVar79._8_4_ = 0xffffffff;
        auVar79._0_8_ = 0xffffffffffffffff;
        auVar79._12_4_ = 0xffffffff;
        auVar79 = (auVar83 | auVar50 & auVar87) ^ auVar79;
        auVar83 = packssdw(auVar79,auVar79);
        auVar50 = packsswb(auVar50 & auVar87,auVar83);
        if ((auVar50 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar37 + 0x340) = lVar41 + -7 < lVar38;
        }
        auVar26._4_4_ = auVar78._0_4_;
        auVar26._0_4_ = auVar78._0_4_;
        auVar26._8_4_ = auVar78._8_4_;
        auVar26._12_4_ = auVar78._8_4_;
        auVar95 = auVar94 & auVar26 | auVar95;
        auVar83 = packssdw(auVar95,auVar95);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar83 = packssdw(auVar83 ^ auVar12,auVar83 ^ auVar12);
        auVar50 = packsswb(auVar50,auVar83);
        if ((auVar50._8_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0x3a8) = lVar41 + -6 < lVar38;
        }
        auVar50 = auVar69 ^ auVar49;
        auVar80._0_4_ = -(uint)(iVar44 < auVar50._0_4_);
        auVar80._4_4_ = -(uint)(iVar61 < auVar50._4_4_);
        auVar80._8_4_ = -(uint)(iVar85 < auVar50._8_4_);
        auVar80._12_4_ = -(uint)(iVar86 < auVar50._12_4_);
        auVar96._4_4_ = auVar80._0_4_;
        auVar96._0_4_ = auVar80._0_4_;
        auVar96._8_4_ = auVar80._8_4_;
        auVar96._12_4_ = auVar80._8_4_;
        iVar100 = -(uint)(auVar50._4_4_ == iVar61);
        iVar104 = -(uint)(auVar50._12_4_ == iVar86);
        auVar27._4_4_ = iVar100;
        auVar27._0_4_ = iVar100;
        auVar27._8_4_ = iVar104;
        auVar27._12_4_ = iVar104;
        auVar103._4_4_ = auVar80._4_4_;
        auVar103._0_4_ = auVar80._4_4_;
        auVar103._8_4_ = auVar80._12_4_;
        auVar103._12_4_ = auVar80._12_4_;
        auVar50 = auVar27 & auVar96 | auVar103;
        auVar50 = packssdw(auVar50,auVar50);
        auVar13._8_4_ = 0xffffffff;
        auVar13._0_8_ = 0xffffffffffffffff;
        auVar13._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 ^ auVar13,auVar50 ^ auVar13);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar37 + 0x410) = lVar41 + -5 < lVar38;
        }
        auVar50 = pshufhw(auVar50,auVar96,0x84);
        auVar28._4_4_ = iVar100;
        auVar28._0_4_ = iVar100;
        auVar28._8_4_ = iVar104;
        auVar28._12_4_ = iVar104;
        auVar87 = pshufhw(auVar80,auVar28,0x84);
        auVar83 = pshufhw(auVar50,auVar103,0x84);
        auVar56._8_4_ = 0xffffffff;
        auVar56._0_8_ = 0xffffffffffffffff;
        auVar56._12_4_ = 0xffffffff;
        auVar56 = (auVar83 | auVar87 & auVar50) ^ auVar56;
        auVar50 = packssdw(auVar56,auVar56);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._10_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0x478) = lVar41 + -4 < lVar38;
        }
        auVar50 = auVar67 ^ auVar49;
        auVar81._0_4_ = -(uint)(iVar44 < auVar50._0_4_);
        auVar81._4_4_ = -(uint)(iVar61 < auVar50._4_4_);
        auVar81._8_4_ = -(uint)(iVar85 < auVar50._8_4_);
        auVar81._12_4_ = -(uint)(iVar86 < auVar50._12_4_);
        auVar29._4_4_ = auVar81._0_4_;
        auVar29._0_4_ = auVar81._0_4_;
        auVar29._8_4_ = auVar81._8_4_;
        auVar29._12_4_ = auVar81._8_4_;
        auVar87 = pshuflw(auVar103,auVar29,0xe8);
        auVar57._0_4_ = -(uint)(auVar50._0_4_ == iVar44);
        auVar57._4_4_ = -(uint)(auVar50._4_4_ == iVar61);
        auVar57._8_4_ = -(uint)(auVar50._8_4_ == iVar85);
        auVar57._12_4_ = -(uint)(auVar50._12_4_ == iVar86);
        auVar97._4_4_ = auVar57._4_4_;
        auVar97._0_4_ = auVar57._4_4_;
        auVar97._8_4_ = auVar57._12_4_;
        auVar97._12_4_ = auVar57._12_4_;
        auVar50 = pshuflw(auVar57,auVar97,0xe8);
        auVar98._4_4_ = auVar81._4_4_;
        auVar98._0_4_ = auVar81._4_4_;
        auVar98._8_4_ = auVar81._12_4_;
        auVar98._12_4_ = auVar81._12_4_;
        auVar83 = pshuflw(auVar81,auVar98,0xe8);
        auVar14._8_4_ = 0xffffffff;
        auVar14._0_8_ = 0xffffffffffffffff;
        auVar14._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 & auVar87,(auVar83 | auVar50 & auVar87) ^ auVar14);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar37 + 0x4e0) = lVar41 + -3 < lVar38;
        }
        auVar30._4_4_ = auVar81._0_4_;
        auVar30._0_4_ = auVar81._0_4_;
        auVar30._8_4_ = auVar81._8_4_;
        auVar30._12_4_ = auVar81._8_4_;
        auVar98 = auVar97 & auVar30 | auVar98;
        auVar83 = packssdw(auVar98,auVar98);
        auVar15._8_4_ = 0xffffffff;
        auVar15._0_8_ = 0xffffffffffffffff;
        auVar15._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50,auVar83 ^ auVar15);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._12_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0x548) = lVar41 + -2 < lVar38;
        }
        auVar50 = auVar65 ^ auVar49;
        auVar82._0_4_ = -(uint)(iVar44 < auVar50._0_4_);
        auVar82._4_4_ = -(uint)(iVar61 < auVar50._4_4_);
        auVar82._8_4_ = -(uint)(iVar85 < auVar50._8_4_);
        auVar82._12_4_ = -(uint)(iVar86 < auVar50._12_4_);
        auVar99._4_4_ = auVar82._0_4_;
        auVar99._0_4_ = auVar82._0_4_;
        auVar99._8_4_ = auVar82._8_4_;
        auVar99._12_4_ = auVar82._8_4_;
        iVar44 = -(uint)(auVar50._4_4_ == iVar61);
        iVar61 = -(uint)(auVar50._12_4_ == iVar86);
        auVar84._4_4_ = iVar44;
        auVar84._0_4_ = iVar44;
        auVar84._8_4_ = iVar61;
        auVar84._12_4_ = iVar61;
        auVar58._4_4_ = auVar82._4_4_;
        auVar58._0_4_ = auVar82._4_4_;
        auVar58._8_4_ = auVar82._12_4_;
        auVar58._12_4_ = auVar82._12_4_;
        auVar58 = auVar84 & auVar99 | auVar58;
        auVar50 = packssdw(auVar58,auVar58);
        auVar16._8_4_ = 0xffffffff;
        auVar16._0_8_ = 0xffffffffffffffff;
        auVar16._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 ^ auVar16,auVar50 ^ auVar16);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar37 + 0x5b0) = lVar41 + -1 < lVar38;
        }
        auVar50 = pshufhw(auVar50,auVar99,0x84);
        auVar83 = pshufhw(auVar82,auVar84,0x84);
        in_XMM11 = auVar83 & auVar50;
        auVar31._4_4_ = auVar82._4_4_;
        auVar31._0_4_ = auVar82._4_4_;
        auVar31._8_4_ = auVar82._12_4_;
        auVar31._12_4_ = auVar82._12_4_;
        auVar50 = pshufhw(auVar50,auVar31,0x84);
        auVar59._8_4_ = 0xffffffff;
        auVar59._0_8_ = 0xffffffffffffffff;
        auVar59._12_4_ = 0xffffffff;
        auVar59 = (auVar50 | in_XMM11) ^ auVar59;
        auVar50 = packssdw(auVar59,auVar59);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._14_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0x618) = lVar41 < lVar38;
        }
        lVar48 = (long)DAT_0016f6a0;
        lVar66 = auVar74._8_8_;
        auVar74._0_8_ = auVar74._0_8_ + lVar48;
        lVar60 = DAT_0016f6a0._8_8_;
        auVar74._8_8_ = lVar66 + lVar60;
        lVar66 = auVar73._8_8_;
        auVar73._0_8_ = auVar73._0_8_ + lVar48;
        auVar73._8_8_ = lVar66 + lVar60;
        lVar66 = auVar72._8_8_;
        auVar72._0_8_ = auVar72._0_8_ + lVar48;
        auVar72._8_8_ = lVar66 + lVar60;
        lVar66 = auVar71._8_8_;
        auVar71._0_8_ = auVar71._0_8_ + lVar48;
        auVar71._8_8_ = lVar66 + lVar60;
        lVar66 = auVar70._8_8_;
        auVar70._0_8_ = auVar70._0_8_ + lVar48;
        auVar70._8_8_ = lVar66 + lVar60;
        lVar66 = auVar69._8_8_;
        auVar69._0_8_ = auVar69._0_8_ + lVar48;
        auVar69._8_8_ = lVar66 + lVar60;
        lVar66 = auVar67._8_8_;
        auVar67._0_8_ = auVar67._0_8_ + lVar48;
        auVar67._8_8_ = lVar66 + lVar60;
        lVar66 = auVar65._8_8_;
        auVar65._0_8_ = auVar65._0_8_ + lVar48;
        auVar65._8_8_ = lVar66 + lVar60;
        pIVar37 = pIVar37 + 0x680;
        lVar48 = lVar41 - (ulong)(iVar36 + 0xfU & 0xfffffff0);
        lVar41 = lVar41 + 0x10;
        auVar50 = _DAT_0016f6a0;
      } while (lVar48 != -1);
    }
  }
  if (iVar39 == iVar42) {
    table->IsUnfrozenRows = true;
    fVar62 = table->RowPosY2;
    fVar47 = (pIVar4->InnerClipRect).Min.y;
    fVar68 = (pIVar4->InnerClipRect).Max.y;
    uVar45 = -(uint)(fVar47 <= fVar62 + 1.0);
    fVar47 = (float)(~uVar45 & (uint)fVar47 | (uint)(fVar62 + 1.0) & uVar45);
    if (fVar68 <= fVar47) {
      fVar47 = fVar68;
    }
    (table->Bg2ClipRectForDrawCmd).Min.y = fVar47;
    (table->BgClipRect).Min.y = fVar47;
    (table->Bg2ClipRectForDrawCmd).Max.y = fVar68;
    (table->BgClipRect).Max.y = fVar68;
    table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
    fVar68 = table->RowPosY1;
    fVar63 = (fVar62 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
    (pIVar4->DC).CursorPos.y = fVar63;
    table->RowPosY2 = fVar63;
    table->RowPosY1 = fVar63 - (fVar62 - fVar68);
    iVar36 = table->ColumnsCount;
    pIVar6 = (table->Columns).Data;
    if (0 < (long)iVar36) {
      lVar38 = 0;
      do {
        (&pIVar6->DrawChannelCurrent)[lVar38] = (&pIVar6->DrawChannelUnfrozen)[lVar38];
        *(float *)((long)&(pIVar6->ClipRect).Min.y + lVar38) = fVar47;
        lVar38 = lVar38 + 0x68;
      } while ((long)iVar36 * 0x68 - lVar38 != 0);
    }
    IVar2 = (pIVar6->ClipRect).Min;
    IVar33 = (pIVar6->ClipRect).Max;
    IVar34 = (pIVar6->ClipRect).Max;
    (pIVar4->ClipRect).Min = (pIVar6->ClipRect).Min;
    (pIVar4->ClipRect).Max = IVar34;
    pIVar5 = pIVar4->DrawList;
    (pIVar5->_CmdHeader).ClipRect.x = IVar2.x;
    (pIVar5->_CmdHeader).ClipRect.y = IVar2.y;
    (pIVar5->_CmdHeader).ClipRect.z = IVar33.x;
    (pIVar5->_CmdHeader).ClipRect.w = IVar33.y;
    pIVar1 = (pIVar4->DrawList->_ClipRectStack).Data +
             (long)(pIVar4->DrawList->_ClipRectStack).Size + -1;
    pIVar1->x = IVar2.x;
    pIVar1->y = IVar2.y;
    pIVar1->z = IVar33.x;
    pIVar1->w = IVar33.y;
    ImDrawListSplitter::SetCurrentChannel
              (&table->DrawSplitter,pIVar4->DrawList,
               (uint)((table->Columns).Data)->DrawChannelCurrent);
  }
  if ((table->field_0x90 & 1) == 0) {
    table->RowBgColorCounter = table->RowBgColorCounter + 1;
  }
  table->IsInsideRow = false;
  return;
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Logging
    if (g.LogEnabled)
        LogRenderedText(NULL, "|");

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        table->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter.SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter.SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}